

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddAbs.c
# Opt level: O3

DdNode * Cudd_bddBooleanDiff(DdManager *manager,DdNode *f,int x)

{
  DdNode *var;
  DdNode *pDVar1;
  
  if (x < manager->size) {
    var = manager->vars[x];
    do {
      manager->reordered = 0;
      pDVar1 = cuddBddBooleanDiffRecur(manager,(DdNode *)((ulong)f & 0xfffffffffffffffe),var);
    } while (manager->reordered == 1);
  }
  else {
    pDVar1 = (DdNode *)((ulong)manager->one ^ 1);
  }
  return pDVar1;
}

Assistant:

DdNode *
Cudd_bddBooleanDiff(
  DdManager * manager,
  DdNode * f,
  int  x)
{
    DdNode *res, *var;

    /* If the variable is not currently in the manager, f cannot
    ** depend on it.
    */
    if (x >= manager->size) return(Cudd_Not(DD_ONE(manager)));
    var = manager->vars[x];

    do {
        manager->reordered = 0;
        res = cuddBddBooleanDiffRecur(manager, Cudd_Regular(f), var);
    } while (manager->reordered == 1);

    return(res);

}